

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O2

void __thiscall CCIT<TTA>::FirstScan(CCIT<TTA> *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  Mat1i *pMVar13;
  Mat1b *pMVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint v;
  ulong uVar26;
  long lVar27;
  long lVar28;
  undefined4 uVar29;
  ulong in_R10;
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  bool bVar37;
  long local_80;
  long local_78;
  long local_70;
  
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar36 = 0;
  memset(*(void **)&pMVar13->field_0x10,0,
         *(long *)&pMVar13->field_0x20 - *(long *)&pMVar13->field_0x18);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar14 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar12 = *(int *)&pMVar13->field_0xc;
  lVar35 = (long)iVar12;
  iVar33 = *(int *)&pMVar13->field_0x8;
  lVar21 = (long)iVar33;
  lVar15 = *(long *)&pMVar14->field_0x10;
  lVar16 = **(long **)&pMVar14->field_0x48;
  lVar3 = lVar15 + lVar16;
  lVar17 = *(long *)&pMVar13->field_0x10;
  do {
    if (iVar12 <= iVar36) {
      uVar26 = 2;
      local_70 = 1;
      local_78 = 3;
      local_80 = 0;
      do {
        if (lVar21 <= (long)uVar26) {
          return;
        }
        pMVar14 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar17 = *(long *)&pMVar14->field_0x10;
        lVar25 = **(long **)&pMVar14->field_0x48;
        lVar15 = lVar17 + lVar25 * uVar26;
        lVar27 = lVar15 - lVar25;
        lVar31 = lVar15 + lVar25;
        lVar1 = *(long *)&pMVar13->field_0x10;
        lVar4 = **(long **)&pMVar13->field_0x48;
        lVar16 = lVar1 + lVar4 * uVar26;
        lVar23 = lVar16 + lVar4 * -2;
        lVar28 = lVar27 + -1;
        lVar3 = lVar23 + -8;
        uVar30 = uVar26 | 1;
        uVar34 = 0;
        while (iVar33 = (int)uVar34, iVar33 < iVar12) {
          lVar24 = (long)iVar33;
          uVar2 = lVar24 + 1;
          iVar36 = (int)uVar2;
          if (*(char *)(lVar15 + lVar24) == '\0') {
            if ((iVar36 < iVar12) && (*(char *)(lVar15 + uVar2) != '\0')) {
              if (*(char *)(lVar27 + uVar2) == '\0') {
                if (*(char *)(lVar27 + lVar24) != '\0') {
                  uVar18 = *(uint *)(lVar23 + lVar24 * 4);
                  in_R10 = (ulong)uVar18;
                  *(uint *)(lVar16 + lVar24 * 4) = uVar18;
                  goto LAB_001c42a1;
                }
LAB_001c4317:
                if (((int)(lVar24 + 2) < iVar12) && (*(char *)(lVar27 + lVar24 + 2) != '\0')) {
                  in_R10 = (ulong)*(uint *)(lVar23 + 8 + lVar24 * 4);
                }
                else {
LAB_001c4332:
                  uVar18 = TTA::NewLabel();
                  in_R10 = (ulong)uVar18;
                }
              }
              else {
                in_R10 = (ulong)*(uint *)(lVar23 + lVar24 * 4);
              }
              *(int *)(lVar16 + lVar24 * 4) = (int)in_R10;
              bVar37 = true;
            }
            else {
              if ((long)uVar30 < lVar21) {
                if (*(char *)(lVar31 + lVar24) == '\0') {
                  if ((iVar36 < iVar12) && (*(char *)(lVar31 + uVar2) != '\0')) goto LAB_001c4332;
                }
                else {
                  uVar18 = TTA::NewLabel();
                  in_R10 = (ulong)uVar18;
                  *(uint *)(lVar16 + lVar24 * 4) = uVar18;
                  if ((iVar36 < iVar12) && (bVar37 = true, *(char *)(lVar31 + uVar2) != '\0'))
                  goto LAB_001c4346;
                }
              }
LAB_001c4276:
              bVar37 = false;
            }
          }
          else if ((iVar36 < iVar12) && (*(char *)(lVar15 + uVar2) != '\0')) {
            if (*(char *)(lVar27 + lVar24) == '\0') {
              if (*(char *)(lVar27 + uVar2) == '\0') {
                if ((iVar33 < 2) || (*(char *)(lVar28 + uVar34) == '\0')) goto LAB_001c4317;
                uVar18 = *(uint *)(lVar3 + uVar34 * 4);
                in_R10 = (ulong)uVar18;
                *(uint *)(lVar16 + lVar24 * 4) = uVar18;
                bVar37 = true;
                if (((int)(uVar34 + 2) < iVar12) && (*(char *)(lVar27 + uVar34 + 2) != '\0')) {
                  uVar18 = *(uint *)(lVar23 + 8 + uVar34 * 4);
                  goto LAB_001c42c2;
                }
              }
              else {
                uVar18 = *(uint *)(lVar23 + lVar24 * 4);
                in_R10 = (ulong)uVar18;
                *(uint *)(lVar16 + lVar24 * 4) = uVar18;
                bVar37 = true;
                if ((1 < iVar33) && (*(char *)(lVar28 + uVar34) != '\0')) {
                  uVar18 = *(uint *)(lVar3 + uVar34 * 4);
LAB_001c42c2:
                  bVar37 = true;
                  TTA::Merge((uint)in_R10,uVar18);
                }
              }
            }
            else {
              uVar18 = *(uint *)(lVar23 + lVar24 * 4);
              in_R10 = (ulong)uVar18;
              *(uint *)(lVar16 + lVar24 * 4) = uVar18;
              bVar37 = true;
              if (*(char *)(lVar27 + uVar2) == '\0') {
LAB_001c42a1:
                bVar37 = true;
                if (((int)(lVar24 + 2) < iVar12) && (*(char *)(lVar27 + lVar24 + 2) != '\0')) {
                  uVar18 = *(uint *)(lVar23 + 8 + lVar24 * 4);
                  goto LAB_001c42c2;
                }
              }
            }
          }
          else {
            if (*(char *)(lVar27 + lVar24) == '\0') {
              if ((iVar33 < 2) || (*(char *)(lVar28 + uVar34) == '\0')) {
                if ((iVar36 < iVar12) && (*(char *)(lVar27 + uVar2) != '\0')) goto LAB_001c40ee;
                uVar18 = TTA::NewLabel();
                goto LAB_001c41e6;
              }
              uVar18 = *(uint *)(lVar3 + uVar34 * 4);
              in_R10 = (ulong)uVar18;
              *(uint *)(lVar16 + lVar24 * 4) = uVar18;
              if (iVar12 <= iVar36) goto LAB_001c4276;
              if (*(char *)(lVar27 + (uVar2 & 0xffffffff)) != '\0') {
                TTA::Merge(uVar18,*(uint *)(lVar23 + lVar24 * 4));
              }
            }
            else {
LAB_001c40ee:
              uVar18 = *(uint *)(lVar23 + lVar24 * 4);
LAB_001c41e6:
              in_R10 = (ulong)uVar18;
              *(uint *)(lVar16 + lVar24 * 4) = uVar18;
            }
            bVar37 = false;
            if ((iVar36 < iVar12) && ((long)uVar30 < lVar21)) {
              bVar37 = *(char *)(lVar31 + uVar2) != '\0';
            }
          }
LAB_001c4346:
          lVar5 = lVar25 * local_70 + lVar17 + 4 + lVar24;
          lVar6 = lVar1 + lVar4 * local_80 + 0x10 + lVar24 * 4;
          lVar20 = lVar25 * local_78 + lVar17 + 3 + lVar24;
          lVar7 = lVar17 + lVar25 * uVar26 + 3 + lVar24;
          lVar8 = lVar1 + lVar4 * uVar26 + 8 + lVar24 * 4;
          for (lVar32 = 0; (uVar18 = (uint)in_R10, bVar37 && (lVar24 + lVar32 + 2 < lVar35));
              lVar32 = lVar32 + 2) {
            lVar10 = lVar24 + 3 + lVar32;
            if (*(char *)(lVar7 + -1 + lVar32) == '\0') {
              if ((lVar10 < lVar35) && (*(char *)(lVar7 + lVar32) != '\0')) {
                if (((long)uVar30 < lVar21) && (*(char *)(lVar20 + -1 + lVar32) != '\0')) {
                  *(uint *)(lVar8 + lVar32 * 4) = uVar18;
                  if (*(char *)(lVar5 + -1 + lVar32) == '\0') {
                    if (*(char *)(lVar5 + -2 + lVar32) != '\0') {
                      if ((lVar24 + lVar32 + 4 < lVar35) && (*(char *)(lVar5 + lVar32) != '\0')) {
                        uVar19 = TTA::Merge(*(uint *)(lVar6 + -8 + lVar32 * 4),
                                            *(uint *)(lVar6 + lVar32 * 4));
                      }
                      else {
                        uVar19 = *(uint *)(lVar6 + -8 + lVar32 * 4);
                      }
                      goto LAB_001c4750;
                    }
                  }
                  else {
                    uVar19 = *(uint *)(lVar6 + -8 + lVar32 * 4);
LAB_001c4750:
                    TTA::Merge(uVar18,uVar19);
                  }
                  if ((lVar24 + lVar32 + 4 < lVar35) && (*(char *)(lVar5 + lVar32) != '\0')) {
                    uVar19 = *(uint *)(lVar6 + lVar32 * 4);
                    goto LAB_001c477c;
                  }
                  goto LAB_001c4781;
                }
                if (*(char *)(lVar5 + -1 + lVar32) == '\0') {
                  if (*(char *)(lVar5 + -2 + lVar32) != '\0') {
                    uVar18 = *(uint *)(lVar6 + -8 + lVar32 * 4);
                    in_R10 = (ulong)uVar18;
                    *(uint *)(lVar8 + lVar32 * 4) = uVar18;
                    bVar37 = true;
                    if ((lVar24 + lVar32 + 4 < lVar35) && (*(char *)(lVar5 + lVar32) != '\0')) {
                      TTA::Merge(uVar18,*(uint *)(lVar6 + lVar32 * 4));
                      in_R10 = (ulong)uVar18;
                    }
                    goto LAB_001c472b;
                  }
                  if ((lVar35 <= lVar24 + lVar32 + 4) || (*(char *)(lVar5 + lVar32) == '\0'))
                  goto LAB_001c4717;
                  in_R10 = (ulong)*(uint *)(lVar6 + lVar32 * 4);
                }
                else {
                  in_R10 = (ulong)*(uint *)(lVar6 + -8 + lVar32 * 4);
                }
LAB_001c471f:
                *(int *)(lVar8 + lVar32 * 4) = (int)in_R10;
LAB_001c4728:
                bVar37 = true;
                goto LAB_001c472b;
              }
              if ((long)uVar30 < lVar21) {
                if (*(char *)(lVar20 + -1 + lVar32) != '\0') {
                  *(uint *)(lVar8 + lVar32 * 4) = uVar18;
                  if (lVar35 <= lVar10) goto LAB_001c45e4;
                  goto LAB_001c4461;
                }
                if ((lVar10 < lVar35) && (*(char *)(lVar20 + lVar32) != '\0')) {
LAB_001c4717:
                  uVar18 = TTA::NewLabel();
                  in_R10 = (ulong)uVar18;
                  goto LAB_001c471f;
                }
              }
LAB_001c45e4:
              bVar37 = false;
            }
            else {
              lVar9 = lVar24 + lVar32;
              *(uint *)(lVar8 + lVar32 * 4) = uVar18;
              if ((lVar35 <= lVar10) || (*(char *)(lVar7 + lVar32) == '\0')) {
                if (*(char *)(lVar5 + -2 + lVar32) == '\0') {
                  if ((-1 < lVar9) && (*(char *)(lVar5 + -3 + lVar32) != '\0')) {
                    if ((lVar10 < lVar35) && (*(char *)(lVar5 + -1 + lVar32) != '\0')) {
                      uVar18 = TTA::Merge(*(uint *)(lVar6 + -0x10 + lVar32 * 4),
                                          *(uint *)(lVar6 + -8 + lVar32 * 4));
                      in_R10 = in_R10 & 0xffffffff;
                    }
                    else {
                      uVar18 = *(uint *)(lVar6 + -0x10 + lVar32 * 4);
                    }
                    goto LAB_001c4435;
                  }
                  if (lVar35 <= lVar10) goto LAB_001c45e4;
                  if (*(char *)(lVar5 + -1 + lVar32) != '\0') goto LAB_001c442c;
                }
                else {
LAB_001c442c:
                  uVar18 = *(uint *)(lVar6 + -8 + lVar32 * 4);
LAB_001c4435:
                  uVar19 = (uint)in_R10;
                  in_R10 = in_R10 & 0xffffffff;
                  TTA::Merge(uVar19,uVar18);
                }
                if ((lVar10 < lVar35) && ((long)uVar30 < lVar21)) {
LAB_001c4461:
                  bVar37 = true;
                  if (*(char *)(lVar20 + lVar32) != '\0') goto LAB_001c472b;
                }
                goto LAB_001c45e4;
              }
              cVar11 = *(char *)(lVar5 + -1 + lVar32);
              if (*(char *)(lVar5 + -2 + lVar32) != '\0') {
                if (((cVar11 == '\0') && (lVar24 + lVar32 + 4 < lVar35)) &&
                   (*(char *)(lVar5 + lVar32) != '\0')) {
                  uVar19 = *(uint *)(lVar6 + -8 + lVar32 * 4);
LAB_001c4417:
                  v = *(uint *)(lVar6 + lVar32 * 4);
LAB_001c45a4:
                  uVar19 = TTA::Merge(uVar19,v);
                }
                else {
LAB_001c45b3:
                  uVar19 = *(uint *)(lVar6 + -8 + lVar32 * 4);
                }
LAB_001c45c2:
                in_R10 = in_R10 & 0xffffffff;
                TTA::Merge(uVar18,uVar19);
                goto LAB_001c4728;
              }
              if (cVar11 != '\0') {
                if ((lVar9 < 0) || (*(char *)(lVar5 + -3 + lVar32) == '\0')) goto LAB_001c45b3;
                uVar19 = *(uint *)(lVar6 + -0x10 + lVar32 * 4);
                v = *(uint *)(lVar6 + -8 + lVar32 * 4);
                goto LAB_001c45a4;
              }
              if ((-1 < lVar9) && (*(char *)(lVar5 + -3 + lVar32) != '\0')) {
                if ((lVar24 + lVar32 + 4 < lVar35) && (*(char *)(lVar5 + lVar32) != '\0')) {
                  uVar19 = *(uint *)(lVar6 + -0x10 + lVar32 * 4);
                  goto LAB_001c4417;
                }
                uVar19 = *(uint *)(lVar6 + -0x10 + lVar32 * 4);
                goto LAB_001c45c2;
              }
              bVar37 = true;
              if ((lVar35 <= lVar24 + lVar32 + 4) || (*(char *)(lVar5 + lVar32) == '\0'))
              goto LAB_001c472b;
              uVar19 = *(uint *)(lVar6 + lVar32 * 4);
LAB_001c477c:
              TTA::Merge(uVar18,uVar19);
LAB_001c4781:
              bVar37 = true;
              in_R10 = in_R10 & 0xffffffff;
            }
LAB_001c472b:
          }
          uVar34 = (ulong)(iVar33 + (int)lVar32 + 2);
        }
        uVar26 = uVar26 + 2;
        local_70 = local_70 + 2;
        local_80 = local_80 + 2;
        local_78 = local_78 + 2;
      } while( true );
    }
    lVar25 = (long)iVar36;
    if (*(char *)(lVar15 + lVar25) == '\0') {
      lVar1 = lVar25 + 1;
      iVar22 = (int)lVar1;
      if ((iVar12 <= iVar22) || (*(char *)(lVar15 + lVar1) == '\0')) {
        if (1 < iVar33) {
          if (*(char *)(lVar3 + lVar25) == '\0') {
            if ((iVar22 < iVar12) && (*(char *)(lVar3 + lVar1) != '\0')) goto LAB_001c3e12;
          }
          else {
            uVar18 = TTA::NewLabel();
            in_R10 = (ulong)uVar18;
            *(uint *)(lVar17 + lVar25 * 4) = uVar18;
            if ((iVar22 < iVar12) && (bVar37 = true, *(char *)(lVar3 + lVar1) != '\0'))
            goto LAB_001c3e70;
          }
        }
        goto LAB_001c3e6e;
      }
LAB_001c3e12:
      uVar18 = TTA::NewLabel();
      in_R10 = (ulong)uVar18;
      *(uint *)(lVar17 + lVar25 * 4) = uVar18;
      bVar37 = true;
    }
    else {
      uVar18 = TTA::NewLabel();
      in_R10 = (ulong)uVar18;
      *(uint *)(lVar17 + lVar25 * 4) = uVar18;
      lVar1 = lVar25 + 1;
      if ((iVar12 <= (int)lVar1) ||
         ((bVar37 = true, *(char *)(lVar15 + lVar1) == '\0' &&
          ((iVar33 < 2 || (*(char *)(lVar3 + lVar1) == '\0')))))) {
LAB_001c3e6e:
        bVar37 = false;
      }
    }
LAB_001c3e70:
    lVar1 = lVar15 + 3 + lVar25;
    lVar4 = lVar15 + 3 + lVar16 + lVar25;
    lVar23 = lVar17 + 8 + lVar25 * 4;
    for (lVar31 = 0; (bVar37 && (lVar31 + lVar25 + 2 < lVar35)); lVar31 = lVar31 + 2) {
      lVar27 = lVar25 + 3 + lVar31;
      uVar29 = (undefined4)in_R10;
      if (*(char *)(lVar1 + -1 + lVar31) == '\0') {
        if ((lVar27 < lVar35) && (*(char *)(lVar1 + lVar31) != '\0')) {
          if ((iVar33 < 2) || (*(char *)(lVar4 + -1 + lVar31) == '\0')) {
LAB_001c3f21:
            uVar18 = TTA::NewLabel();
            in_R10 = (ulong)uVar18;
            *(uint *)(lVar23 + lVar31 * 4) = uVar18;
          }
          else {
            *(undefined4 *)(lVar23 + lVar31 * 4) = uVar29;
          }
          bVar37 = true;
          goto LAB_001c3f33;
        }
        if (1 < iVar33) {
          if (*(char *)(lVar4 + -1 + lVar31) == '\0') {
            if ((lVar27 < lVar35) && (*(char *)(lVar4 + lVar31) != '\0')) goto LAB_001c3f21;
          }
          else {
            *(undefined4 *)(lVar23 + lVar31 * 4) = uVar29;
            if (lVar27 < lVar35) goto LAB_001c3f0c;
          }
        }
LAB_001c3f31:
        bVar37 = false;
      }
      else {
        *(undefined4 *)(lVar23 + lVar31 * 4) = uVar29;
        if (lVar35 <= lVar27) goto LAB_001c3f31;
        bVar37 = true;
        if (*(char *)(lVar1 + lVar31) == '\0') {
          if (1 < iVar33) {
LAB_001c3f0c:
            bVar37 = true;
            if (*(char *)(lVar4 + lVar31) != '\0') goto LAB_001c3f33;
          }
          goto LAB_001c3f31;
        }
      }
LAB_001c3f33:
    }
    iVar36 = iVar36 + (int)lVar31 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }